

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool CScript::IsPayToAnchor
               (int version,vector<unsigned_char,_std::allocator<unsigned_char>_> *program)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  if (in_EDI == 1) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_ffffffffffffffd8);
    bVar4 = false;
    if (sVar2 == 2) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RSI,(ulong)CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0
                                                ));
      bVar4 = false;
      if (*pvVar3 == 'N') {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (in_RSI,(ulong)CONCAT16(in_stack_ffffffffffffffe6,
                                                   in_stack_ffffffffffffffe0));
        bVar4 = *pvVar3 == 's';
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPayToAnchor(int version, const std::vector<unsigned char>& program)
{
    return version == 1 &&
        program.size() == 2 &&
        program[0] == 0x4e &&
        program[1] == 0x73;
}